

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
          (String *__return_storage_ptr__,kj *this,char (*params) [71],String *params_1,
          char (*params_2) [9],StringPtr *params_3,char (*params_4) [2],StringPtr *params_5,
          char (*params_6) [32])

{
  char (*value) [71];
  String *value_00;
  char (*value_01) [9];
  StringPtr *pSVar1;
  char (*value_02) [2];
  char (*value_03) [32];
  String *params_6_00;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  char (*params_local_4) [2];
  StringPtr *params_local_3;
  char (*params_local_2) [9];
  String *params_local_1;
  char (*params_local) [71];
  
  params_6_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [2])params_2;
  params_local_3 = (StringPtr *)params_1;
  params_local_2 = (char (*) [9])params;
  params_local_1 = (String *)this;
  params_local = (char (*) [71])__return_storage_ptr__;
  value = ::const((char (*) [71])this);
  local_48 = toCharSequence<char_const(&)[71]>(value);
  value_00 = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  local_58 = toCharSequence<kj::String>(value_00);
  value_01 = ::const((char (*) [9])params_local_3);
  local_68 = toCharSequence<char_const(&)[9]>(value_01);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_local_4);
  local_78 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_02 = ::const((char (*) [2])local_38);
  local_88 = toCharSequence<char_const(&)[2]>(value_02);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_4);
  local_98 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_03 = ::const((char (*) [32])params_5);
  local_a8 = toCharSequence<char_const(&)[32]>(value_03);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_6_00,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,&local_98,&local_a8,
             (ArrayPtr<const_char> *)params_6_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}